

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paf_parser_test.cpp
# Opt level: O0

void __thiscall bioparser::test::BioparserPafTest::Check(BioparserPafTest *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_d0;
  Message local_c8 [2];
  unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>
  *local_b8;
  unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>
  *local_b0;
  int local_a8 [2];
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_2;
  Message local_88 [2];
  unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>
  *local_78;
  unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>
  *local_70;
  int local_68 [2];
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  Message local_48 [3];
  size_type local_30;
  int local_24;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  BioparserPafTest *this_local;
  
  local_24 = 500;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_30 = std::
             vector<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
             ::size(&this->o);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_20,"500","o.size()",&local_24,&local_30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]bioparser/test/paf_parser_test.cpp"
               ,0x3a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_68[1] = 0x178de;
  local_70 = (unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>
              *)std::
                vector<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
                ::begin(&this->o);
  local_78 = (unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>
              *)std::
                vector<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
                ::end(&this->o);
  local_68[0] = std::
                accumulate<__gnu_cxx::__normal_iterator<std::unique_ptr<bioparser::test::PafOverlap,std::default_delete<bioparser::test::PafOverlap>>*,std::vector<std::unique_ptr<bioparser::test::PafOverlap,std::default_delete<bioparser::test::PafOverlap>>,std::allocator<std::unique_ptr<bioparser::test::PafOverlap,std::default_delete<bioparser::test::PafOverlap>>>>>,int,bioparser::test::BioparserPafTest::Check()::_lambda(unsigned_int,std::unique_ptr<bioparser::test::PafOverlap,std::default_delete<bioparser::test::PafOverlap>>const&)_1_>
                          (local_70,local_78,0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_60,"96478",
             "std::accumulate(o.begin(), o.end(), 0, [] (std::uint32_t s, const std::unique_ptr<PafOverlap>& it) { return s + it->q_name.size() + it->t_name.size(); })"
             ,local_68 + 1,local_68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(local_88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]bioparser/test/paf_parser_test.cpp"
               ,0x3e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  local_a8[1] = 0x119de3a;
  local_b0 = (unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>
              *)std::
                vector<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
                ::begin(&this->o);
  local_b8 = (unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>
              *)std::
                vector<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
                ::end(&this->o);
  local_a8[0] = std::
                accumulate<__gnu_cxx::__normal_iterator<std::unique_ptr<bioparser::test::PafOverlap,std::default_delete<bioparser::test::PafOverlap>>*,std::vector<std::unique_ptr<bioparser::test::PafOverlap,std::default_delete<bioparser::test::PafOverlap>>,std::allocator<std::unique_ptr<bioparser::test::PafOverlap,std::default_delete<bioparser::test::PafOverlap>>>>>,int,bioparser::test::BioparserPafTest::Check()::_lambda(unsigned_int,std::unique_ptr<bioparser::test::PafOverlap,std::default_delete<bioparser::test::PafOverlap>>const&)_2_>
                          (local_b0,local_b8,0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_a0,"18472506",
             "std::accumulate(o.begin(), o.end(), 0, [] (std::uint32_t s, const std::unique_ptr<PafOverlap>& it) { return s + it->lhs_id + it->lhs_begin + it->lhs_end + it->q_len + it->rhs_id + it->rhs_begin + it->rhs_end + it->t_len + it->score + it->strand + it->overlap_len + it->quality; })"
             ,local_a8 + 1,local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]bioparser/test/paf_parser_test.cpp"
               ,0x48,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message(local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  return;
}

Assistant:

void Check() {
    EXPECT_EQ(500, o.size());
    EXPECT_EQ(96478, std::accumulate(o.begin(), o.end(), 0,
        [] (std::uint32_t s, const std::unique_ptr<PafOverlap>& it) {
          return s + it->q_name.size() + it->t_name.size();
        }));
    EXPECT_EQ(18472506, std::accumulate(o.begin(), o.end(), 0,
        [] (std::uint32_t s, const std::unique_ptr<PafOverlap>& it) {
          return s +
              it->lhs_id + it->lhs_begin + it->lhs_end + it->q_len +
              it->rhs_id + it->rhs_begin + it->rhs_end + it->t_len +
              it->score +
              it->strand +
              it->overlap_len +
              it->quality;
        }));
  }